

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

size_t M_GetPos(Matrix *M,size_t RoC,size_t Entry)

{
  LASErrIdType LVar1;
  size_t sVar2;
  
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    if (((RoC == 0 || M->ElOrder != Rowws) || (M->RowDim < RoC)) &&
       ((M->ElOrder != Clmws || RoC == 0 || ((M->ClmDim < RoC || (M->Len[RoC] <= Entry)))))) {
      sVar2 = 0;
      LASError(LASRangeErr,"M_GetPos",M->Name,(char *)0x0,(char *)0x0);
    }
    else {
      sVar2 = M->El[RoC][Entry].Pos;
    }
  }
  else {
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

size_t M_GetPos(Matrix *M, size_t RoC, size_t Entry)
/* returns the position of a matrix entry */
{
    size_t Pos;

    if (LASResult() == LASOK)
        if ((M->ElOrder == Rowws && RoC > 0 && RoC <= M->RowDim) ||
            ((M->ElOrder == Clmws && RoC > 0 && RoC <= M->ClmDim) &&
            (Entry < M->Len[RoC]))) {
            Pos = M->El[RoC][Entry].Pos;
        } else {
            LASError(LASRangeErr, "M_GetPos", M->Name, NULL, NULL);
	    Pos = 0;
        }
    else
        Pos = 0;
    return(Pos);
}